

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

int slang::ast::Statement::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  SyntaxKind SVar1;
  uint uVar2;
  Compilation *pCVar3;
  long lVar4;
  long lVar5;
  SyntaxKind *pSVar6;
  bool bVar7;
  bool bVar8;
  StatementBlockKind SVar9;
  int iVar10;
  Statement *pSVar11;
  ProceduralBlockSymbol *pPVar12;
  Diagnostic *this;
  InvalidStatement *pIVar13;
  undefined4 extraout_var;
  BlockStatement *pBVar14;
  char in_CL;
  long lVar15;
  uint uVar16;
  undefined4 in_register_00000014;
  StatementContext *stmtCtx;
  long lVar17;
  undefined4 in_register_0000003c;
  Compilation *syntax;
  int in_R8D;
  SourceRange SVar18;
  string_view arg;
  BlockStatement *pBStack_110;
  ulong uStack_108;
  SyntaxNode *pSStack_100;
  Compilation *pCStack_f8;
  ASTContext AStack_f0;
  undefined1 auStack_b8 [64];
  sockaddr *psStack_78;
  Compilation *pCStack_70;
  SourceRange local_40;
  
  syntax = (Compilation *)CONCAT44(in_register_0000003c,__fd);
  stmtCtx = (StatementContext *)CONCAT44(in_register_00000014,__len);
  pCVar3 = (Compilation *)**(undefined8 **)__addr;
  SVar1 = (((StatementSyntax *)&syntax->super_BumpAllocator)->super_SyntaxNode).kind;
  if ((in_R8D == 0) &&
     (lVar15._0_4_ = (syntax->options).maxCheckerInstanceDepth,
     lVar15._4_4_ = (syntax->options).maxGenerateSteps, lVar15 != 0)) {
    if ((int)SVar1 < 0x15d) {
      if ((SVar1 != ForLoopStatement) && (SVar1 != ForeachLoopStatement)) goto LAB_0024a494;
    }
    else if ((SVar1 != ParallelBlockStatement) &&
            ((SVar1 != RandSequenceStatement && (SVar1 != SequentialBlockStatement)))) {
LAB_0024a494:
      pSVar11 = StatementContext::tryGetBlock(stmtCtx,(ASTContext *)__addr,(SyntaxNode *)syntax);
      return (int)pSVar11;
    }
  }
  if ((int)SVar1 < 0x109) {
    if ((int)SVar1 < 0x9e) {
      if ((int)SVar1 < 0x5e) {
        if ((int)SVar1 < 0x38) {
LAB_0024a3dc:
          pSVar11 = ConcurrentAssertionStatement::fromSyntax
                              (pCVar3,(ConcurrentAssertionStatementSyntax *)syntax,
                               (ASTContext *)__addr,stmtCtx);
        }
        else if (SVar1 == BlockingEventTriggerStatement) {
LAB_0024a4c6:
          pSVar11 = EventTriggerStatement::fromSyntax
                              (pCVar3,(EventTriggerStatementSyntax *)syntax,(ASTContext *)__addr,
                               stmtCtx);
        }
        else if (SVar1 == CaseStatement) {
          pSVar11 = CaseStatement::fromSyntax
                              (pCVar3,(CaseStatementSyntax *)syntax,(ASTContext *)__addr,stmtCtx);
        }
        else {
          pSVar11 = ProceduralCheckerStatement::fromSyntax
                              (pCVar3,(CheckerInstanceStatementSyntax *)syntax,(ASTContext *)__addr,
                               stmtCtx);
        }
      }
      else if ((int)SVar1 < 0x95) {
        if (SVar1 - CoverPropertyStatement < 2) goto LAB_0024a3dc;
        pSVar11 = ConditionalStatement::fromSyntax
                            (pCVar3,(ConditionalStatementSyntax *)syntax,(ASTContext *)__addr,
                             stmtCtx);
      }
      else if (SVar1 == DisableForkStatement) {
        pSVar11 = DisableForkStatement::fromSyntax(pCVar3,(DisableForkStatementSyntax *)syntax);
      }
      else {
        pSVar11 = DisableStatement::fromSyntax
                            (pCVar3,(DisableStatementSyntax *)syntax,(ASTContext *)__addr);
      }
    }
    else if ((int)SVar1 < 0xd5) {
      if ((int)SVar1 < 0xc1) {
        if (SVar1 == DoWhileStatement) {
          pSVar11 = DoWhileLoopStatement::fromSyntax
                              (pCVar3,(DoWhileStatementSyntax *)syntax,(ASTContext *)__addr,stmtCtx)
          ;
        }
        else {
          local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
          pSVar11 = &BumpAllocator::emplace<slang::ast::EmptyStatement,slang::SourceRange>
                               ((BumpAllocator *)pCVar3,&local_40)->super_Statement;
          if ((in_CL != '\0') &&
             (*(long *)&(syntax->options).defaultTimeScale.
                        super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                        super__Optional_payload_base<slang::TimeScale>._M_engaged == 0)) {
            SVar18 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
            ASTContext::addDiag((ASTContext *)__addr,(DiagCode)0x590008,SVar18);
          }
        }
      }
      else {
        if (SVar1 == ExpectPropertyStatement) goto LAB_0024a3dc;
        if (SVar1 == ExpressionStatement) {
          pSVar11 = ExpressionStatement::fromSyntax
                              (pCVar3,(ExpressionStatementSyntax *)syntax,(ASTContext *)__addr,
                               stmtCtx);
        }
        else {
          pSVar11 = StatementContext::tryGetBlock(stmtCtx,(ASTContext *)__addr,(SyntaxNode *)syntax)
          ;
          if (pSVar11 != (Statement *)0x0) goto LAB_0024a731;
          pSVar11 = ForLoopStatement::fromSyntax
                              (pCVar3,(ForLoopStatementSyntax *)syntax,(ASTContext *)__addr,stmtCtx)
          ;
        }
      }
    }
    else if ((int)SVar1 < 0xef) {
      if (SVar1 == ForeachLoopStatement) {
        pSVar11 = StatementContext::tryGetBlock(stmtCtx,(ASTContext *)__addr,(SyntaxNode *)syntax);
        if (pSVar11 != (Statement *)0x0) goto LAB_0024a731;
        pSVar11 = ForeachLoopStatement::fromSyntax
                            (pCVar3,(ForeachLoopStatementSyntax *)syntax,(ASTContext *)__addr,
                             stmtCtx);
      }
      else {
        if (SVar1 != ForeverStatement) goto LAB_0024a4b0;
        pSVar11 = ForeverLoopStatement::fromSyntax
                            (pCVar3,(ForeverStatementSyntax *)syntax,(ASTContext *)__addr,stmtCtx);
      }
    }
    else {
LAB_0024a4b0:
      pSVar11 = ImmediateAssertionStatement::fromSyntax
                          (pCVar3,(ImmediateAssertionStatementSyntax *)syntax,(ASTContext *)__addr,
                           stmtCtx);
    }
  }
  else if ((int)SVar1 < 0x189) {
    if ((int)SVar1 < 0x15d) {
      if (SVar1 == JumpStatement) {
        if ((short)(syntax->options).topModules.table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                   .arrays.groups_size_index == 0x6e) {
          pSVar11 = BreakStatement::fromSyntax
                              (pCVar3,(JumpStatementSyntax *)syntax,(ASTContext *)__addr,stmtCtx);
        }
        else {
          pSVar11 = ContinueStatement::fromSyntax
                              (pCVar3,(JumpStatementSyntax *)syntax,(ASTContext *)__addr,stmtCtx);
        }
      }
      else {
        if (SVar1 != LoopStatement) goto LAB_0024a4c6;
        if ((short)(syntax->options).topModules.table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                   .arrays.groups_size_index == 0x104) {
          pSVar11 = RepeatLoopStatement::fromSyntax
                              (pCVar3,(LoopStatementSyntax *)syntax,(ASTContext *)__addr,stmtCtx);
        }
        else {
          pSVar11 = WhileLoopStatement::fromSyntax
                              (pCVar3,(LoopStatementSyntax *)syntax,(ASTContext *)__addr,stmtCtx);
        }
      }
    }
    else {
      switch(SVar1) {
      case ProceduralAssignStatement:
      case ProceduralForceStatement:
        pSVar11 = ProceduralAssignStatement::fromSyntax
                            (pCVar3,(ProceduralAssignStatementSyntax *)syntax,(ASTContext *)__addr);
        break;
      case ProceduralDeassignStatement:
      case ProceduralReleaseStatement:
        pSVar11 = ProceduralDeassignStatement::fromSyntax
                            (pCVar3,(ProceduralDeassignStatementSyntax *)syntax,(ASTContext *)__addr
                            );
        break;
      default:
        if (SVar1 == ParallelBlockStatement) {
LAB_0024a5a3:
          pSVar11 = StatementContext::tryGetBlock(stmtCtx,(ASTContext *)__addr,(SyntaxNode *)syntax)
          ;
          if (pSVar11 != (Statement *)0x0) goto LAB_0024a731;
          pSVar11 = BlockStatement::fromSyntax
                              (pCVar3,(BlockStatementSyntax *)syntax,(ASTContext *)__addr,stmtCtx,
                               false);
        }
        else {
          pSVar11 = RandCaseStatement::fromSyntax
                              (pCVar3,(RandCaseStatementSyntax *)syntax,(ASTContext *)__addr,stmtCtx
                              );
        }
      }
    }
  }
  else if ((int)SVar1 < 0x1a6) {
    if (SVar1 == RandSequenceStatement) {
      pSVar11 = StatementContext::tryGetBlock(stmtCtx,(ASTContext *)__addr,(SyntaxNode *)syntax);
      if (pSVar11 != (Statement *)0x0) goto LAB_0024a731;
      pSVar11 = RandSequenceStatement::fromSyntax
                          (pCVar3,(RandSequenceStatementSyntax *)syntax,(ASTContext *)__addr);
    }
    else {
      if (SVar1 == RestrictPropertyStatement) goto LAB_0024a3dc;
      pSVar11 = ReturnStatement::fromSyntax
                          (pCVar3,(ReturnStatementSyntax *)syntax,(ASTContext *)__addr,stmtCtx);
    }
  }
  else if (SVar1 - VoidCastedCallStatement < 5) {
    uVar2 = (&switchD_0024a47f::switchdataD_00468db8)[SVar1 - VoidCastedCallStatement];
    lVar15 = (long)(int)uVar2;
    switch(SVar1) {
    case VoidCastedCallStatement:
      pSVar11 = ExpressionStatement::fromSyntax
                          (pCVar3,(VoidCastedCallStatementSyntax *)syntax,(ASTContext *)__addr);
      break;
    case VoidType:
      AStack_f0.assertionInstance = (AssertionInstanceDetails *)stmtCtx[1].blocks._M_ptr;
      AStack_f0.scope.ptr = (Scope *)(stmtCtx->blocks)._M_ptr;
      AStack_f0._8_8_ = (stmtCtx->blocks)._M_extent._M_extent_value;
      AStack_f0.flags.m_bits = *(underlying_type *)&stmtCtx->flags;
      AStack_f0.instanceOrProc = *(Symbol **)&(stmtCtx->lastEventControl).startLoc;
      AStack_f0.firstTempVar = *(TempVarSymbol **)&(stmtCtx->lastEventControl).endLoc;
      AStack_f0.randomizeDetails = (RandomizeDetails *)stmtCtx->rootAstContext;
      psStack_78 = __addr;
      pCStack_70 = pCVar3;
      SVar9 = SemanticFacts::getStatementBlockKind((BlockStatementSyntax *)__addr);
      if ((AStack_f0.flags.m_bits & 0x1800) == 0) {
        if (SVar9 == Sequential) {
          uVar16 = *(uint *)((long)&UINT_00468dc8 + lVar15);
          goto LAB_0024a88e;
        }
        bVar7 = ASTContext::inAlwaysCombLatch(&AStack_f0);
        if (bVar7) {
          pPVar12 = ASTContext::getProceduralBlock(&AStack_f0);
          SVar18 = parsing::Token::range((Token *)(__addr[5].sa_data + 6));
          this = ASTContext::addDiag(&AStack_f0,(DiagCode)0x1c0008,SVar18);
          arg = SemanticFacts::getProcedureKindStr(pPVar12->procedureKind);
          Diagnostic::operator<<(this,arg);
          goto LAB_0024a82f;
        }
LAB_0024a863:
        uVar16 = *(uint *)((long)&UINT_00468dc8 + lVar15);
      }
      else {
        if (SVar9 - JoinAll < 2) {
          SVar18 = parsing::Token::range((Token *)(__addr[10].sa_data + 6));
          ASTContext::addDiag(&AStack_f0,(DiagCode)0x4d0008,SVar18);
LAB_0024a82f:
          auStack_b8._0_8_ = (Statement *)0x0;
          pIVar13 = BumpAllocator::
                    emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                              ((BumpAllocator *)syntax,(Statement **)auStack_b8);
          return (int)pIVar13;
        }
        if (SVar9 == JoinNone) {
          AStack_f0.flags.m_bits = AStack_f0.flags.m_bits & 0x1fffffffe7ff;
          goto LAB_0024a863;
        }
        uVar16 = *(uint *)((long)&UINT_00468dc8 + lVar15);
        if (SVar9 == Sequential) goto LAB_0024a88e;
      }
      *(uint *)((long)&UINT_00468dc8 + lVar15) = uVar16 & 0x14 | 2;
LAB_0024a88e:
      auStack_b8._0_8_ = auStack_b8 + 0x18;
      auStack_b8._8_8_ = 0;
      auStack_b8._16_8_ = 5;
      if ((char)in_R8D != '\0') {
        bindScopeInitializers
                  (&AStack_f0,(SmallVectorBase<const_slang::ast::Statement_*> *)auStack_b8);
      }
      if ((SVar9 & ~JoinAll) == JoinAny) {
        AStack_f0.flags.m_bits = AStack_f0.flags.m_bits | 0x40000000000;
      }
      lVar4._0_2_ = __addr[10].sa_family;
      lVar4._2_1_ = __addr[10].sa_data[0];
      lVar4._3_1_ = __addr[10].sa_data[1];
      lVar4._4_1_ = __addr[10].sa_data[2];
      lVar4._5_1_ = __addr[10].sa_data[3];
      lVar4._6_1_ = __addr[10].sa_data[4];
      lVar4._7_1_ = __addr[10].sa_data[5];
      uStack_108 = (ulong)SVar9;
      pSStack_100 = (SyntaxNode *)__addr;
      pCStack_f8 = syntax;
      if (lVar4 == 0) {
        bVar7 = false;
      }
      else {
        lVar5 = *(long *)(__addr[9].sa_data + 6);
        lVar17 = 0;
        bVar7 = false;
        do {
          pSVar6 = *(SyntaxKind **)(lVar5 + lVar17);
          bVar8 = slang::syntax::StatementSyntax::isKind(*pSVar6);
          if (bVar8) {
            iVar10 = bind((int)pSVar6,(sockaddr *)&AStack_f0,uVar2 + 0x468db8);
            pBStack_110 = (BlockStatement *)CONCAT44(extraout_var,iVar10);
            SmallVectorBase<slang::ast::Statement_const*>::
            emplace_back<slang::ast::Statement_const*>
                      ((SmallVectorBase<slang::ast::Statement_const*> *)auStack_b8,
                       (Statement **)&pBStack_110);
            bVar7 = (bool)(bVar7 | (((BlockStatement *)CONCAT44(extraout_var,iVar10))->
                                   super_Statement).kind == Invalid);
          }
          lVar17 = lVar17 + 8;
        } while (lVar4 << 3 != lVar17);
      }
      pCVar3 = pCStack_f8;
      pBVar14 = createBlockStatement
                          (pCStack_f8,(SmallVectorBase<const_slang::ast::Statement_*> *)auStack_b8,
                           pSStack_100,(StatementBlockKind)uStack_108);
      if (bVar7) {
        pBStack_110 = pBVar14;
        pBVar14 = (BlockStatement *)
                  BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                            (&pCVar3->super_BumpAllocator,(Statement **)&pBStack_110);
      }
      if ((Statement *)auStack_b8._0_8_ != (Statement *)(auStack_b8 + 0x18)) {
        operator_delete((void *)auStack_b8._0_8_);
      }
      *(uint *)((long)&UINT_00468dc8 + lVar15) =
           uVar16 & 0xb | *(uint *)((long)&UINT_00468dc8 + lVar15) & 0x14;
      return (int)pBVar14;
    case WaitForkStatement:
      pSVar11 = WaitForkStatement::fromSyntax
                          (pCVar3,(WaitForkStatementSyntax *)syntax,(ASTContext *)__addr);
      break;
    case WaitOrderStatement:
      pSVar11 = WaitOrderStatement::fromSyntax
                          (pCVar3,(WaitOrderStatementSyntax *)syntax,(ASTContext *)__addr,stmtCtx);
      break;
    case WaitStatement:
      pSVar11 = WaitStatement::fromSyntax
                          (pCVar3,(WaitStatementSyntax *)syntax,(ASTContext *)__addr,stmtCtx);
    }
  }
  else {
    if (SVar1 == SequentialBlockStatement) goto LAB_0024a5a3;
    pSVar11 = TimedStatement::fromSyntax
                        (pCVar3,(TimingControlStatementSyntax *)syntax,(ASTContext *)__addr,stmtCtx)
    ;
  }
  pSVar11->syntax = (StatementSyntax *)syntax;
  ASTContext::setAttributes
            ((ASTContext *)__addr,pSVar11,
             *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
              &(syntax->options).languageVersion);
LAB_0024a731:
  return (int)pSVar11;
}

Assistant:

const Statement& Statement::bind(const StatementSyntax& syntax, const ASTContext& context,
                                 StatementContext& stmtCtx, bool inList, bool labelHandled) {
    auto& comp = context.getCompilation();

    if (!labelHandled && hasSimpleLabel(syntax)) {
        auto block = stmtCtx.tryGetBlock(context, syntax);
        SLANG_ASSERT(block);
        return *block;
    }

    Statement* result;
    switch (syntax.kind) {
        case SyntaxKind::EmptyStatement:
            result = comp.emplace<EmptyStatement>(syntax.sourceRange());
            if (inList && syntax.attributes.empty())
                context.addDiag(diag::EmptyStatement, syntax.sourceRange());
            break;
        case SyntaxKind::ReturnStatement:
            result = &ReturnStatement::fromSyntax(comp, syntax.as<ReturnStatementSyntax>(), context,
                                                  stmtCtx);
            break;
        case SyntaxKind::JumpStatement: {
            auto& jump = syntax.as<JumpStatementSyntax>();
            if (jump.breakOrContinue.kind == TokenKind::BreakKeyword)
                result = &BreakStatement::fromSyntax(comp, jump, context, stmtCtx);
            else
                result = &ContinueStatement::fromSyntax(comp, jump, context, stmtCtx);
            break;
        }
        case SyntaxKind::DisableStatement:
            result = &DisableStatement::fromSyntax(comp, syntax.as<DisableStatementSyntax>(),
                                                   context);
            break;
        case SyntaxKind::ConditionalStatement:
            result = &ConditionalStatement::fromSyntax(comp,
                                                       syntax.as<ConditionalStatementSyntax>(),
                                                       context, stmtCtx);
            break;
        case SyntaxKind::CaseStatement:
            result = &CaseStatement::fromSyntax(comp, syntax.as<CaseStatementSyntax>(), context,
                                                stmtCtx);
            break;
        case SyntaxKind::ForLoopStatement:
            // We might have an implicit block here; check for that first.
            if (auto block = stmtCtx.tryGetBlock(context, syntax))
                return *block;

            result = &ForLoopStatement::fromSyntax(comp, syntax.as<ForLoopStatementSyntax>(),
                                                   context, stmtCtx);
            break;
        case SyntaxKind::LoopStatement: {
            auto& loop = syntax.as<LoopStatementSyntax>();
            if (loop.repeatOrWhile.kind == TokenKind::RepeatKeyword)
                result = &RepeatLoopStatement::fromSyntax(comp, loop, context, stmtCtx);
            else
                result = &WhileLoopStatement::fromSyntax(comp, loop, context, stmtCtx);
            break;
        }
        case SyntaxKind::ForeachLoopStatement:
            // We might have an implicit block here; check for that first.
            if (auto block = stmtCtx.tryGetBlock(context, syntax))
                return *block;

            result = &ForeachLoopStatement::fromSyntax(comp,
                                                       syntax.as<ForeachLoopStatementSyntax>(),
                                                       context, stmtCtx);
            break;
        case SyntaxKind::DoWhileStatement:
            result = &DoWhileLoopStatement::fromSyntax(comp, syntax.as<DoWhileStatementSyntax>(),
                                                       context, stmtCtx);
            break;
        case SyntaxKind::ForeverStatement:
            result = &ForeverLoopStatement::fromSyntax(comp, syntax.as<ForeverStatementSyntax>(),
                                                       context, stmtCtx);
            break;
        case SyntaxKind::ExpressionStatement:
            result = &ExpressionStatement::fromSyntax(comp, syntax.as<ExpressionStatementSyntax>(),
                                                      context, stmtCtx);
            break;
        case SyntaxKind::VoidCastedCallStatement:
            result = &ExpressionStatement::fromSyntax(comp,
                                                      syntax.as<VoidCastedCallStatementSyntax>(),
                                                      context);
            break;
        case SyntaxKind::SequentialBlockStatement:
        case SyntaxKind::ParallelBlockStatement:
            // A block statement may or may not match up with a hierarchy node. Handle both cases
            // here. We traverse statements in the same order as the findBlocks call below, so this
            // should always sync up exactly.
            if (auto block = stmtCtx.tryGetBlock(context, syntax))
                return *block;

            result = &BlockStatement::fromSyntax(comp, syntax.as<BlockStatementSyntax>(), context,
                                                 stmtCtx);
            break;
        case SyntaxKind::TimingControlStatement:
            result = &TimedStatement::fromSyntax(comp, syntax.as<TimingControlStatementSyntax>(),
                                                 context, stmtCtx);
            break;
        case SyntaxKind::ImmediateAssertStatement:
        case SyntaxKind::ImmediateAssumeStatement:
        case SyntaxKind::ImmediateCoverStatement:
            result = &ImmediateAssertionStatement::fromSyntax(
                comp, syntax.as<ImmediateAssertionStatementSyntax>(), context, stmtCtx);
            break;
        case SyntaxKind::DisableForkStatement:
            result = &DisableForkStatement::fromSyntax(comp,
                                                       syntax.as<DisableForkStatementSyntax>());
            break;
        case SyntaxKind::WaitStatement:
            result = &WaitStatement::fromSyntax(comp, syntax.as<WaitStatementSyntax>(), context,
                                                stmtCtx);
            break;
        case SyntaxKind::WaitForkStatement:
            result = &WaitForkStatement::fromSyntax(comp, syntax.as<WaitForkStatementSyntax>(),
                                                    context);
            break;
        case SyntaxKind::WaitOrderStatement:
            result = &WaitOrderStatement::fromSyntax(comp, syntax.as<WaitOrderStatementSyntax>(),
                                                     context, stmtCtx);
            break;
        case SyntaxKind::BlockingEventTriggerStatement:
        case SyntaxKind::NonblockingEventTriggerStatement:
            result = &EventTriggerStatement::fromSyntax(comp,
                                                        syntax.as<EventTriggerStatementSyntax>(),
                                                        context, stmtCtx);
            break;
        case SyntaxKind::ProceduralAssignStatement:
        case SyntaxKind::ProceduralForceStatement:
            result = &ProceduralAssignStatement::fromSyntax(
                comp, syntax.as<ProceduralAssignStatementSyntax>(), context);
            break;
        case SyntaxKind::ProceduralDeassignStatement:
        case SyntaxKind::ProceduralReleaseStatement:
            result = &ProceduralDeassignStatement::fromSyntax(
                comp, syntax.as<ProceduralDeassignStatementSyntax>(), context);
            break;
        case SyntaxKind::AssertPropertyStatement:
        case SyntaxKind::AssumePropertyStatement:
        case SyntaxKind::CoverPropertyStatement:
        case SyntaxKind::ExpectPropertyStatement:
        case SyntaxKind::CoverSequenceStatement:
        case SyntaxKind::RestrictPropertyStatement:
            result = &ConcurrentAssertionStatement::fromSyntax(
                comp, syntax.as<ConcurrentAssertionStatementSyntax>(), context, stmtCtx);
            break;
        case SyntaxKind::RandCaseStatement:
            result = &RandCaseStatement::fromSyntax(comp, syntax.as<RandCaseStatementSyntax>(),
                                                    context, stmtCtx);
            break;
        case SyntaxKind::RandSequenceStatement:
            // We might have an implicit block here; check for that first.
            if (auto block = stmtCtx.tryGetBlock(context, syntax))
                return *block;

            result = &RandSequenceStatement::fromSyntax(comp,
                                                        syntax.as<RandSequenceStatementSyntax>(),
                                                        context);
            break;
        case SyntaxKind::CheckerInstanceStatement:
            result = &ProceduralCheckerStatement::fromSyntax(
                comp, syntax.as<CheckerInstanceStatementSyntax>(), context, stmtCtx);
            break;
        default:
            SLANG_UNREACHABLE;
    }

    result->syntax = &syntax;
    context.setAttributes(*result, syntax.attributes);
    return *result;
}